

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# submit-6MixQuery.cpp
# Opt level: O2

void AddPolygonFromMixQuery
               (int id,int n,
               vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               *polygon)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  pointer ppVar3;
  long lVar4;
  ulong uVar5;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *__range1;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double local_48;
  undefined8 uStack_40;
  double local_38;
  undefined8 uStack_30;
  
  local_38 = -5000000.0;
  uStack_30 = 0xc15312d000000000;
  local_48 = 5000000.0;
  uStack_40 = 0x415312d000000000;
  for (ppVar3 = (polygon->
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      ppVar3 != (polygon->
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; ppVar3 = ppVar3 + 1) {
    auVar7._8_8_ = uStack_40;
    auVar7._0_8_ = local_48;
    auVar7 = minpd((undefined1  [16])*ppVar3,auVar7);
    auVar6._8_8_ = uStack_30;
    auVar6._0_8_ = local_38;
    auVar6 = maxpd((undefined1  [16])*ppVar3,auVar6);
    local_48 = auVar7._0_8_;
    uStack_40 = auVar7._8_8_;
    local_38 = auVar6._0_8_;
    uStack_30 = auVar6._8_8_;
  }
  RTree<int,_double,_2,_double,_8,_4>::Insert(&Rtree,&local_48,&local_38,&Poly_cnt);
  ppVar3 = (polygon->
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar4 = 0;
  uVar5 = 0;
  if (0 < n) {
    uVar5 = (ulong)(uint)n;
  }
  for (; uVar5 * 0x10 != lVar4; lVar4 = lVar4 + 0x10) {
    puVar1 = (undefined8 *)((long)&ppVar3->first + lVar4);
    uVar2 = puVar1[1];
    *(undefined8 *)((long)pgon[0] + lVar4) = *puVar1;
    *(undefined8 *)((long)pgon[0] + lVar4 + 8) = uVar2;
  }
  GridSetup(pgon,n,100,(pGridSet)(PolyGrid + Poly_cnt));
  Poly_id[Poly_cnt] = id;
  Poly_cnt = Poly_cnt + 1;
  return;
}

Assistant:

void AddPolygonFromMixQuery(int id, int n, std::vector<std::pair<double, double>> &polygon) {
    double mnx = MAX_POS, mny = MAX_POS, mxx = -MAX_POS, mxy = -MAX_POS;
    for (auto now : polygon)
    {
        if (now.first < mnx) mnx = now.first;
        if (now.second < mny) mny = now.second;
        if (now.first > mxx) mxx = now.first;
        if (now.second > mxy) mxy = now.second;
    }
    Rect R = Rect(mnx, mny, mxx, mxy);
    Rtree.Insert(R.min, R.max, Poly_cnt);

    for (int i = 0; i < n; i++)
        pgon[i][0] = polygon[i].first,
        pgon[i][1] = polygon[i].second;
    GridSetup(pgon, n, Grid_Resolution, &PolyGrid[Poly_cnt]);
    Poly_id[Poly_cnt] = id;
    Poly_cnt ++;
}